

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

void __thiscall cli::Parser::~Parser(Parser *this)

{
  size_type sVar1;
  reference ppCVar2;
  size_t n;
  size_t i;
  Parser *this_local;
  
  n = 0;
  sVar1 = std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::size
                    (&this->_commands);
  for (; n < sVar1; n = n + 1) {
    ppCVar2 = std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::
              operator[](&this->_commands,n);
    if (*ppCVar2 != (value_type)0x0) {
      (*(*ppCVar2)->_vptr_CmdBase[1])();
    }
  }
  std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::~vector
            (&this->_commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_arguments);
  std::__cxx11::string::~string((string *)&this->_general_help_text);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Parser() {
			for (size_t i = 0, n = _commands.size(); i < n; ++i) {
				delete _commands[i];
			}
		}